

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
 draco::CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>
           (PredictionSchemeMethod method,int att_id,PointCloudDecoder *decoder,
           PredictionSchemeWrapDecodingTransform<int,_int> *transform)

{
  bool bVar1;
  int iVar2;
  pointer __p;
  PointCloud *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
  in_RDI;
  PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_> *in_R8;
  uint16_t in_stack_00000016;
  Transform *in_stack_00000018;
  int in_stack_00000020;
  PredictionSchemeMethod in_stack_00000024;
  MeshDecoder *in_stack_00000028;
  MeshDecoder *mesh_decoder;
  PointAttribute *att;
  unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
  *ret;
  nullptr_t in_stack_ffffffffffffff88;
  PointCloud *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
  *in_stack_ffffffffffffffa0;
  
  if (in_ESI == -2) {
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    PointCloudDecoder::point_cloud((PointCloudDecoder *)in_RCX);
    PointCloud::attribute
              (in_stack_ffffffffffffff90,(int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    iVar2 = (*in_RCX->_vptr_PointCloud[2])();
    if (iVar2 == 1) {
      PointCloudDecoder::bitstream_version((PointCloudDecoder *)in_RCX);
      CreateMeshPredictionScheme<draco::MeshDecoder,draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,draco::MeshPredictionSchemeDecoderFactory<int>>
                (in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_00000018,
                 in_stack_00000016);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                          *)0x1e1ca8);
      if (bVar1) {
        return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
                )(tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                  )in_RDI.
                   super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                   .
                   super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_false>
                   ._M_head_impl;
      }
      std::
      unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
      ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                     *)in_RCX);
      in_stack_ffffffffffffff90 = in_RCX;
      in_stack_ffffffffffffff98 = in_ESI;
      in_stack_ffffffffffffff9c = in_EDX;
      in_stack_ffffffffffffffa0 = in_R8;
    }
    __p = (pointer)operator_new(0x40);
    PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
    PredictionSchemeDeltaDecoder
              (in_stack_ffffffffffffffa0,
               (PointAttribute *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (PredictionSchemeWrapDecodingTransform<int,_int> *)in_stack_ffffffffffffff90);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff90,__p);
  }
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
          )(tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
            )in_RDI.
             super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
             .
             super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_false>
             ._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>
CreatePredictionSchemeForDecoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudDecoder *decoder,
                                 const TransformT &transform) {
  if (method == PREDICTION_NONE) {
    return nullptr;
  }
  const PointAttribute *const att = decoder->point_cloud()->attribute(att_id);
  if (decoder->GetGeometryType() == TRIANGULAR_MESH) {
    // Cast the decoder to mesh decoder. This is not necessarily safe if there
    // is some other decoder decides to use TRIANGULAR_MESH as the return type,
    // but unfortunately there is not nice work around for this without using
    // RTTI (double dispatch and similar concepts will not work because of the
    // template nature of the prediction schemes).
    const MeshDecoder *const mesh_decoder =
        static_cast<const MeshDecoder *>(decoder);

    auto ret = CreateMeshPredictionScheme<
        MeshDecoder, PredictionSchemeDecoder<DataTypeT, TransformT>,
        MeshPredictionSchemeDecoderFactory<DataTypeT>>(
        mesh_decoder, method, att_id, transform, decoder->bitstream_version());
    if (ret) {
      return ret;
    }
    // Otherwise try to create another prediction scheme.
  }
  // Create delta decoder.
  return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
      new PredictionSchemeDeltaDecoder<DataTypeT, TransformT>(att, transform));
}